

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rq_failprob.c
# Opt level: O0

int main(int argc,char **argv)

{
  _Bool _Var1;
  int iVar2;
  time_t tVar3;
  char **in_RSI;
  int in_EDI;
  int c;
  int seed;
  int nIter;
  int K;
  uint local_30;
  uint local_1c;
  uint local_4;
  
  local_1c = 0;
  while( true ) {
    iVar2 = getopt(in_EDI,in_RSI,"hk:i:s:");
    if (iVar2 == -1) {
      if ((int)local_1c < 0) {
        tVar3 = time((time_t *)0x0);
        local_30 = (uint)tVar3;
      }
      else {
        local_30 = local_1c;
      }
      srand(local_30);
      _Var1 = test_fprob((int)((ulong)in_RSI >> 0x20),(int)in_RSI);
      local_4 = (uint)!_Var1;
      return local_4;
    }
    if (iVar2 == 0x3f) break;
    if (iVar2 == 0x68) {
      usage();
      exit(0);
    }
    if (iVar2 == 0x69) {
      atoi(_optarg);
    }
    else if (iVar2 == 0x6b) {
      atoi(_optarg);
    }
    else if (iVar2 == 0x73) {
      local_1c = atoi(_optarg);
    }
  }
  exit(1);
}

Assistant:

int main(int argc, char** argv)
{
	int K = 100;
	int nIter = 500;
	int seed = 0;

	/* scan command lines */
	int c;
	while ((c = getopt(argc, argv, "hk:i:s:")) != -1) {
		switch (c) {
		case 'h':
			usage();
			exit(EXIT_SUCCESS);
		case 'k':
			K = atoi(optarg);
			break;
		case 'i':
			nIter = atoi(optarg);
			break;
		case 's':
			seed = atoi(optarg);
			break;
		case '?':
			exit(EXIT_FAILURE);
		};
	}

	/* Run tests */
	srand(seed < 0 ? time(0) : seed);
	if (!test_fprob(K, nIter))
		return EXIT_FAILURE;

	return EXIT_SUCCESS;
}